

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O2

_Bool get_item_allow(object *obj,uchar ch,cmd_code cmd,_Bool is_harmless)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  byte bVar5;
  undefined7 in_register_00000009;
  char *pcVar6;
  int iVar7;
  char verify_inscrip [3];
  char prompt_buf [1024];
  char local_42c;
  byte bStack_42b;
  undefined1 local_42a;
  char local_428 [1024];
  
  local_42a = 0;
  bVar5 = ch | 0x40;
  if (0x1f < ch) {
    bVar5 = ch;
  }
  _local_42c = CONCAT11(bVar5,0x21);
  uVar2 = check_for_inscrip(obj,&local_42c);
  if ((int)CONCAT71(in_register_00000009,is_harmless) == 0) {
    uVar3 = check_for_inscrip(obj,"!*");
    uVar2 = uVar2 + uVar3;
  }
  _Var1 = true;
  if (uVar2 != 0) {
    pcVar4 = cmd_verb(cmd);
    pcVar6 = "do that with";
    if (pcVar4 != (char *)0x0) {
      pcVar6 = pcVar4;
    }
    strnfmt(local_428,0x400,"Really %s",pcVar6);
    iVar7 = uVar2 + 1;
    do {
      iVar7 = iVar7 + -1;
      if (iVar7 == 0) {
        return true;
      }
      _Var1 = verify_object(local_428,obj,player);
    } while (_Var1);
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool get_item_allow(const struct object *obj, unsigned char ch, cmd_code cmd,
					bool is_harmless)
{
	char verify_inscrip[] = "!*";

	unsigned n;

	/*
	 * Hack - Only shift the command key if it actually needs to be shifted.
	 * Because UN_KTRL('ctrl-d') (i.e. rogue-like ignore command) gives 'd'
	 * which is the drop command in both keysets, use UN_KTRL_CAP().
	 */
	if (ch < 0x20)
		ch = UN_KTRL_CAP(ch);

	/* The inscription to look for */
	verify_inscrip[1] = ch;

	/* Look for the inscription */
	n = check_for_inscrip(obj, verify_inscrip);

	/* Also look for the inscription '!*' */
	if (!is_harmless)
		n += check_for_inscrip(obj, "!*");

	/* Choose string for the prompt */
	if (n) {
		char prompt_buf[1024];

		const char *verb = cmd_verb(cmd);
		if (!verb)
			verb = "do that with";

		strnfmt(prompt_buf, sizeof(prompt_buf), "Really %s", verb);

		/* Prompt for confirmation n times */
		while (n--) {
			if (!verify_object(prompt_buf, obj, player)) {
				return false;
			}
		}
	}

	/* Allow it */
	return (true);
}